

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

uint jenkins_hash(uint a)

{
  uint uVar1;
  
  uVar1 = a * 0x1001 + 0x7ed55d16;
  uVar1 = uVar1 >> 0x13 ^ uVar1 ^ 0xc761c23c;
  uVar1 = (uVar1 * 0x4200 + 0xaccf6200 ^ uVar1 * 0x21 + 0xe9f8cc1d) * 9 + 0xfd7046c5;
  return uVar1 >> 0x10 ^ uVar1 ^ 0xb55a4f09;
}

Assistant:

unsigned int jenkins_hash(unsigned int a)
{
    a = (a + 0x7ed55d16) + (a << 12);
    a = (a ^ 0xc761c23c) ^ (a >> 19);
    a = (a + 0x165667b1) + (a << 5);
    a = (a + 0xd3a2646c) ^ (a << 9);
    a = (a + 0xfd7046c5) + (a << 3);
    a = (a ^ 0xb55a4f09) ^ (a >> 16);
    return a;
}